

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

ConstantValue * slang::ast::OpInfo::eval(BinaryOperator op,ConstantValue *cvl,ConstantValue *cvr)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  ConstantValue *pCVar4;
  ConstantValue *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  ConstantValue *in_RDI;
  float fVar5;
  double __x;
  double dVar6;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  string *r_1;
  string *l_4;
  logic_t l_3;
  ConstantValue result;
  CVIterator<true> ri;
  CVIterator<true> li;
  float l_2;
  double l_1;
  SVInt *r;
  SVInt *l;
  undefined7 in_stack_fffffffffffff8b8;
  undefined1 in_stack_fffffffffffff8bf;
  self_type *in_stack_fffffffffffff8c0;
  ConstantValue *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  int in_stack_fffffffffffff8d4;
  iterator_facade<slang::CVIterator<true>,_false> *in_stack_fffffffffffff8d8;
  SVInt *in_stack_fffffffffffff8e0;
  SVInt *in_stack_fffffffffffff8e8;
  SVInt *in_stack_fffffffffffff920;
  SVInt *in_stack_fffffffffffff928;
  SVInt *in_stack_fffffffffffff930;
  SVInt *in_stack_fffffffffffff938;
  SVInt *in_stack_fffffffffffff940;
  SVInt *in_stack_fffffffffffff948;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  bool *in_stack_fffffffffffff990;
  bool *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  BinaryOperator in_stack_fffffffffffff9ac;
  SVInt *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  double in_stack_fffffffffffffa48;
  double in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  BinaryOperator op_00;
  logic_t local_375;
  int local_374;
  real_t local_2c0;
  undefined1 local_2b7;
  undefined1 local_2b6;
  undefined1 local_2b5;
  shortreal_t local_2b4;
  shortreal_t local_2b0;
  float local_2ac;
  shortreal_t local_2a8;
  undefined1 local_2a3;
  undefined1 local_2a2;
  undefined1 local_2a1;
  real_t local_2a0;
  real_t local_298;
  double local_290;
  shortreal_t local_288;
  undefined1 local_281;
  real_t local_280;
  undefined1 local_271;
  SVInt local_270;
  uint8_t local_259;
  uint8_t local_241;
  uint8_t local_229;
  uint8_t local_211;
  uint8_t local_1f9;
  uint8_t local_1e1;
  uint8_t local_1c9;
  uint8_t local_1b1;
  uint8_t local_19a;
  uint8_t local_199;
  uint8_t local_181;
  logic_t local_169 [24];
  logic_t local_151 [24];
  uint8_t local_139;
  uint8_t local_121;
  SVInt *local_30;
  ConstantValue *in_stack_ffffffffffffffd8;
  
  fVar5 = (float)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  op_00 = (BinaryOperator)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbc12b6);
  if ((bVar1) &&
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbc12c9), bVar1)) {
    bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xbc12f0);
    if (bVar1) {
      slang::ConstantValue::integer((ConstantValue *)0xbc1306);
      bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xbc131b);
      if (bVar1) {
        local_30 = slang::ConstantValue::integer((ConstantValue *)0xbc1331);
        switch(in_ESI) {
        case 0:
          SVInt::operator+(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 1:
          SVInt::operator-(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 2:
          SVInt::operator*(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 3:
          SVInt::operator/((SVInt *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                           in_stack_fffffffffffff9c0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 4:
          SVInt::operator%((SVInt *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                           in_stack_fffffffffffff9c0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 5:
          SVInt::operator&(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 6:
          SVInt::operator|(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 7:
          SVInt::operator^(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 8:
          SVInt::xnor(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 9:
          local_121 = (uint8_t)SVInt::operator==(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0
                                                );
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 10:
          local_139 = (uint8_t)SVInt::operator!=((SVInt *)in_stack_fffffffffffff8c8,
                                                 (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0xb:
          bVar1 = exactlyEqual(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
          logic_t::logic_t(local_151,bVar1);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0xc:
          bVar1 = exactlyEqual(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
          logic_t::logic_t(local_169,!bVar1);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0xd:
          local_1b1 = (uint8_t)SVInt::operator>=((SVInt *)in_stack_fffffffffffff8c8,
                                                 (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0xe:
          local_1c9 = (uint8_t)SVInt::operator>((SVInt *)in_stack_fffffffffffff8c8,
                                                (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0xf:
          local_1e1 = (uint8_t)SVInt::operator<=((SVInt *)in_stack_fffffffffffff8c8,
                                                 (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x10:
          local_1f9 = (uint8_t)SVInt::operator<(in_stack_fffffffffffff938,in_stack_fffffffffffff930)
          ;
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x11:
          local_181 = (uint8_t)condWildcardEqual(in_stack_fffffffffffff928,in_stack_fffffffffffff920
                                                );
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x12:
          local_19a = (uint8_t)condWildcardEqual(in_stack_fffffffffffff928,in_stack_fffffffffffff920
                                                );
          local_199 = (uint8_t)logic_t::operator!((logic_t *)
                                                  CONCAT17(in_stack_fffffffffffff8bf,
                                                           in_stack_fffffffffffff8b8));
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x13:
          local_211 = (uint8_t)SVInt::operator&&((SVInt *)in_stack_fffffffffffff8c8,
                                                 (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x14:
          local_229 = (uint8_t)SVInt::operator||((SVInt *)in_stack_fffffffffffff8c8,
                                                 (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x15:
          local_241 = (uint8_t)SVInt::logicalImpl((SVInt *)in_stack_fffffffffffff8c8,
                                                  (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x16:
          local_259 = (uint8_t)SVInt::logicalEquiv((SVInt *)in_stack_fffffffffffff8c8,
                                                   (SVInt *)in_stack_fffffffffffff8c0);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x17:
          SVInt::shl((SVInt *)in_stack_fffffffffffff8d8,
                     (SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x18:
          SVInt::lshr((SVInt *)in_stack_fffffffffffff8d8,
                      (SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x19:
          SVInt::shl((SVInt *)in_stack_fffffffffffff8d8,
                     (SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x1a:
          SVInt::ashr((SVInt *)in_stack_fffffffffffff8d8,
                      (SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          break;
        case 0x1b:
          SVInt::pow(&local_270,__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff8c0,
                     (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        }
      }
      else {
        bVar1 = slang::ConstantValue::isReal((ConstantValue *)0xbc216c);
        if (bVar1) {
          local_280 = slang::ConstantValue::real
                                ((ConstantValue *)
                                 CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          dVar6 = real_t::operator_cast_to_double(&local_280);
          local_271 = dVar6 != 0.0;
          (anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
                    (in_stack_fffffffffffff9ac,
                     (SVInt *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     in_stack_fffffffffffff998);
        }
        else {
          bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0xbc2204);
          if (bVar1) {
            local_288 = slang::ConstantValue::shortReal
                                  ((ConstantValue *)
                                   CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
            fVar5 = shortreal_t::operator_cast_to_float(&local_288);
            local_281 = fVar5 != 0.0;
            (anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
                      (in_stack_fffffffffffff9ac,
                       (SVInt *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                       in_stack_fffffffffffff998);
          }
        }
      }
    }
    else {
      bVar1 = slang::ConstantValue::isReal((ConstantValue *)0xbc22a4);
      if (bVar1) {
        local_298 = slang::ConstantValue::real
                              ((ConstantValue *)
                               CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
        local_290 = real_t::operator_cast_to_double(&local_298);
        bVar1 = slang::ConstantValue::isReal((ConstantValue *)0xbc22e6);
        if (bVar1) {
          local_2a0 = slang::ConstantValue::real
                                ((ConstantValue *)
                                 CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          real_t::operator_cast_to_double(&local_2a0);
          (anonymous_namespace)::evalFloatOp<slang::real_t,double>
                    (op_00,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        }
        else {
          bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xbc2361);
          if (bVar1) {
            local_2a1 = local_290 != 0.0;
            slang::ConstantValue::integer((ConstantValue *)0xbc23a3);
            (anonymous_namespace)::evalLogicalOp<bool,slang::SVInt>
                      ((BinaryOperator)((ulong)in_stack_fffffffffffff998 >> 0x20),
                       in_stack_fffffffffffff990,
                       (SVInt *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988));
          }
          else {
            bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0xbc23d4);
            if (bVar1) {
              local_2a2 = local_290 != 0.0;
              local_2a8 = slang::ConstantValue::shortReal
                                    ((ConstantValue *)
                                     CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
              fVar5 = shortreal_t::operator_cast_to_float(&local_2a8);
              local_2a3 = fVar5 != 0.0;
              (anonymous_namespace)::evalLogicalOp<bool,bool>
                        (in_stack_fffffffffffff9ac,
                         (bool *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                         in_stack_fffffffffffff998);
            }
          }
        }
      }
      else {
        bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0xbc2485);
        if (bVar1) {
          local_2b0 = slang::ConstantValue::shortReal
                                ((ConstantValue *)
                                 CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          local_2ac = shortreal_t::operator_cast_to_float(&local_2b0);
          bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0xbc24c7);
          if (bVar1) {
            local_2b4 = slang::ConstantValue::shortReal
                                  ((ConstantValue *)
                                   CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
            shortreal_t::operator_cast_to_float(&local_2b4);
            (anonymous_namespace)::evalFloatOp<slang::shortreal_t,float>
                      ((BinaryOperator)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                       (float)in_stack_fffffffffffffa38,fVar5);
          }
          else {
            bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xbc2542);
            if (bVar1) {
              local_2b5 = local_2ac != 0.0;
              slang::ConstantValue::integer((ConstantValue *)0xbc2583);
              (anonymous_namespace)::evalLogicalOp<bool,slang::SVInt>
                        ((BinaryOperator)((ulong)in_stack_fffffffffffff998 >> 0x20),
                         in_stack_fffffffffffff990,
                         (SVInt *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988));
            }
            else {
              bVar1 = slang::ConstantValue::isReal((ConstantValue *)0xbc25b4);
              if (bVar1) {
                local_2b6 = local_2ac != 0.0;
                local_2c0 = slang::ConstantValue::real
                                      ((ConstantValue *)
                                       CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8)
                                      );
                dVar6 = real_t::operator_cast_to_double(&local_2c0);
                local_2b7 = dVar6 != 0.0;
                (anonymous_namespace)::evalLogicalOp<bool,bool>
                          (in_stack_fffffffffffff9ac,
                           (bool *)CONCAT44(in_ESI,in_stack_fffffffffffff9a0),
                           in_stack_fffffffffffff998);
              }
            }
          }
        }
        else {
          bVar1 = slang::ConstantValue::isContainer((ConstantValue *)in_stack_fffffffffffff8c0);
          if (bVar1) {
            sVar2 = slang::ConstantValue::size((ConstantValue *)in_stack_fffffffffffff8c0);
            sVar3 = slang::ConstantValue::size((ConstantValue *)in_stack_fffffffffffff8c0);
            if (sVar2 == sVar3) {
              begin<const_slang::ConstantValue,_true>(in_stack_fffffffffffff8c8);
              begin<const_slang::ConstantValue,_true>(in_stack_fffffffffffff8c8);
              while( true ) {
                end<const_slang::ConstantValue,_true>(in_stack_fffffffffffff8c8);
                bVar1 = operator==<slang::CVIterator<true>_>
                                  (in_stack_fffffffffffff8c0,
                                   (CVIterator<true> *)
                                   CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
                if (((bVar1 ^ 0xffU) & 1) == 0) break;
                iterator_facade<slang::CVIterator<true>,_false>::operator*
                          ((iterator_facade<slang::CVIterator<true>,_false> *)0xbc2780);
                iterator_facade<slang::CVIterator<true>,_false>::operator*
                          ((iterator_facade<slang::CVIterator<true>,_false> *)0xbc2795);
                eval((BinaryOperator)((ulong)in_RDX >> 0x20),in_RCX,in_stack_ffffffffffffffd8);
                bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbc27c9);
                if (bVar1) {
                  slang::ConstantValue::integer((ConstantValue *)0xbc2828);
                  local_375 = SVInt::operator_cast_to_logic_t
                                        ((SVInt *)CONCAT17(in_stack_fffffffffffff8bf,
                                                           in_stack_fffffffffffff8b8));
                  logic_t::isUnknown(&local_375);
                  logic_t::operator!((logic_t *)
                                     CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
                  bVar1 = operator||(false,(logic_t)0x0);
                  if (bVar1) {
                    SVInt::SVInt((SVInt *)in_stack_fffffffffffff8c8,
                                 (logic_t)(uint8_t)((uint)in_stack_fffffffffffff8d4 >> 0x18));
                    slang::ConstantValue::ConstantValue
                              ((ConstantValue *)in_stack_fffffffffffff8c0,
                               (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8
                                                ));
                    SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,
                                                    in_stack_fffffffffffff8d0));
                    local_374 = 1;
                  }
                  else {
                    local_374 = 0;
                  }
                }
                else {
                  slang::ConstantValue::ConstantValue
                            ((ConstantValue *)in_stack_fffffffffffff8c0,
                             (nullptr_t)
                             CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
                  local_374 = 1;
                }
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc2951);
                if (local_374 != 0) {
                  return in_RDI;
                }
                iterator_facade<slang::CVIterator<true>,_false>::
                operator++<slang::CVIterator<true>_>
                          (in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4);
                iterator_facade<slang::CVIterator<true>,_false>::
                operator++<slang::CVIterator<true>_>
                          (in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4);
              }
              SVInt::SVInt<bool>((SVInt *)in_stack_fffffffffffff8c0,(bool)in_stack_fffffffffffff8bf)
              ;
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)in_stack_fffffffffffff8c0,
                         (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
              SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            }
            else {
              SVInt::SVInt<bool>((SVInt *)in_stack_fffffffffffff8c0,(bool)in_stack_fffffffffffff8bf)
              ;
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)in_stack_fffffffffffff8c0,
                         (SVInt *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
              SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            }
          }
          else {
            bVar1 = slang::ConstantValue::isString((ConstantValue *)0xbc2a20);
            if (bVar1) {
              slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0xbc2a36);
              slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0xbc2a4b);
              pCVar4 = (ConstantValue *)
                       (*(code *)(&DAT_00cd0fec + *(int *)(&DAT_00cd0fec + (ulong)(in_ESI - 9) * 4))
                       )();
              return pCVar4;
            }
            bVar1 = slang::ConstantValue::isNullHandle((ConstantValue *)0xbc2ee4);
            if (bVar1) {
              pCVar4 = (ConstantValue *)
                       (*(code *)(&DAT_00cd0fdc + *(int *)(&DAT_00cd0fdc + (ulong)(in_ESI - 9) * 4))
                       )();
              return pCVar4;
            }
            bVar1 = slang::ConstantValue::isUnion((ConstantValue *)0xbc30a4);
            if ((bVar1) && (bVar1 = slang::ConstantValue::isUnion((ConstantValue *)0xbc30ba), bVar1)
               ) {
              pCVar4 = (ConstantValue *)
                       (*(code *)(&DAT_00cd0fcc + *(int *)(&DAT_00cd0fcc + (ulong)(in_ESI - 9) * 4))
                       )();
              return pCVar4;
            }
          }
        }
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffff8c0,
               (nullptr_t)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
  }
  return in_RDI;
}

Assistant:

ConstantValue OpInfo::eval(BinaryOperator op, const ConstantValue& cvl, const ConstantValue& cvr) {
    if (!cvl || !cvr)
        return nullptr;

#define OP(k, v)            \
    case BinaryOperator::k: \
        return v

    if (cvl.isInteger()) {
        const SVInt& l = cvl.integer();

        if (cvr.isInteger()) {
            const SVInt& r = cvr.integer();
            switch (op) {
                OP(Add, l + r);
                OP(Subtract, l - r);
                OP(Multiply, l * r);
                OP(Divide, l / r);
                OP(Mod, l % r);
                OP(BinaryAnd, l & r);
                OP(BinaryOr, l | r);
                OP(BinaryXor, l ^ r);
                OP(LogicalShiftLeft, l.shl(r));
                OP(LogicalShiftRight, l.lshr(r));
                OP(ArithmeticShiftLeft, l.shl(r));
                OP(ArithmeticShiftRight, l.ashr(r));
                OP(BinaryXnor, l.xnor(r));
                OP(Equality, SVInt(l == r));
                OP(Inequality, SVInt(l != r));
                OP(CaseEquality, SVInt((logic_t)exactlyEqual(l, r)));
                OP(CaseInequality, SVInt((logic_t)!exactlyEqual(l, r)));
                OP(WildcardEquality, SVInt(condWildcardEqual(l, r)));
                OP(WildcardInequality, SVInt(!condWildcardEqual(l, r)));
                OP(GreaterThanEqual, SVInt(l >= r));
                OP(GreaterThan, SVInt(l > r));
                OP(LessThanEqual, SVInt(l <= r));
                OP(LessThan, SVInt(l < r));
                OP(LogicalAnd, SVInt(l && r));
                OP(LogicalOr, SVInt(l || r));
                OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
                OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
                OP(Power, l.pow(r));
            }
        }
        else if (cvr.isReal()) {
            return evalLogicalOp(op, l, (bool)cvr.real());
        }
        else if (cvr.isShortReal()) {
            return evalLogicalOp(op, l, (bool)cvr.shortReal());
        }
    }
    else if (cvl.isReal()) {
        double l = cvl.real();

        if (cvr.isReal())
            return evalFloatOp<real_t>(op, l, (double)cvr.real());
        else if (cvr.isInteger())
            return evalLogicalOp(op, (bool)l, cvr.integer());
        else if (cvr.isShortReal())
            return evalLogicalOp(op, (bool)l, (bool)cvr.shortReal());
    }
    else if (cvl.isShortReal()) {
        float l = cvl.shortReal();

        if (cvr.isShortReal())
            return evalFloatOp<shortreal_t>(op, l, (float)cvr.shortReal());
        else if (cvr.isInteger())
            return evalLogicalOp(op, (bool)l, cvr.integer());
        else if (cvr.isReal())
            return evalLogicalOp(op, (bool)l, (bool)cvr.real());
    }
    else if (cvl.isContainer()) {
        if (cvl.size() != cvr.size())
            return SVInt(false);

        auto li = begin(cvl);
        auto ri = begin(cvr);
        for (; li != end(cvl); li++, ri++) {
            ConstantValue result = eval(op, *li, *ri);
            if (!result)
                return nullptr;

            logic_t l = (logic_t)result.integer();
            if (l.isUnknown() || !l)
                return SVInt(l);
        }

        return SVInt(true);
    }
    else if (cvl.isString()) {
        auto& l = cvl.str();
        auto& r = cvr.str();

        switch (op) {
            OP(GreaterThanEqual, SVInt(l >= r));
            OP(GreaterThan, SVInt(l > r));
            OP(LessThanEqual, SVInt(l <= r));
            OP(LessThan, SVInt(l < r));
            OP(Equality, SVInt(l == r));
            OP(Inequality, SVInt(l != r));
            OP(CaseEquality, SVInt(l == r));
            OP(CaseInequality, SVInt(l != r));
            default:
                SLANG_UNREACHABLE;
        }
    }
    else if (cvl.isNullHandle()) {
        // Null can only ever appear in contexts where it's being compared to
        // something else that is null.
        switch (op) {
            OP(Equality, SVInt(true));
            OP(Inequality, SVInt(false));
            OP(CaseEquality, SVInt(true));
            OP(CaseInequality, SVInt(false));
            default:
                SLANG_UNREACHABLE;
        }
    }
    else if (cvl.isUnion() && cvr.isUnion()) {
        switch (op) {
            OP(Equality, SVInt(cvl == cvr));
            OP(Inequality, SVInt(cvl != cvr));
            OP(CaseEquality, SVInt(cvl == cvr));
            OP(CaseInequality, SVInt(cvl != cvr));
            default:
                SLANG_UNREACHABLE;
        }
    }

#undef OP
    SLANG_UNREACHABLE;
}